

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O0

void Cba_NtkObjOrder(Cba_Ntk_t *p,Vec_Int_t *vObjs,Vec_Int_t *vNameIds)

{
  int iVar1;
  uint i_00;
  Cba_ObjType_t Type;
  Vec_Ptr_t *p_00;
  char *pcVar2;
  char *local_448;
  char *pInstName;
  char *pTypeName;
  int iObj;
  int i;
  Vec_Ptr_t *vNames;
  char *pName;
  char Buffer [1000];
  Vec_Int_t *vNameIds_local;
  Vec_Int_t *vObjs_local;
  Cba_Ntk_t *p_local;
  
  Buffer._992_8_ = vNameIds;
  iVar1 = Vec_IntSize(vObjs);
  if (1 < iVar1) {
    iVar1 = Vec_IntSize(vObjs);
    p_00 = Vec_PtrAlloc(iVar1);
    for (pTypeName._4_4_ = 0; iVar1 = Vec_IntSize(vObjs), pTypeName._4_4_ < iVar1;
        pTypeName._4_4_ = pTypeName._4_4_ + 1) {
      i_00 = Vec_IntEntry(vObjs,pTypeName._4_4_);
      Type = Cba_ObjType(p,i_00);
      pcVar2 = Cba_NtkTypeName(p,Type);
      if (Buffer._992_8_ == 0) {
        local_448 = Cba_ObjNameStr(p,i_00);
      }
      else {
        iVar1 = Vec_IntEntry((Vec_Int_t *)Buffer._992_8_,pTypeName._4_4_);
        local_448 = Cba_NtkStr(p,iVar1);
      }
      sprintf((char *)&pName,"%s_%s_%d",pcVar2,local_448,(ulong)i_00);
      pcVar2 = Abc_UtilStrsav((char *)&pName);
      Vec_PtrPush(p_00,pcVar2);
    }
    Vec_PtrSort(p_00,Cba_StrCmp);
    Vec_IntClear(vObjs);
    for (pTypeName._4_4_ = 0; iVar1 = Vec_PtrSize(p_00), pTypeName._4_4_ < iVar1;
        pTypeName._4_4_ = pTypeName._4_4_ + 1) {
      pcVar2 = (char *)Vec_PtrEntry(p_00,pTypeName._4_4_);
      pcVar2 = strrchr(pcVar2,0x5f);
      iVar1 = atoi(pcVar2 + 1);
      Vec_IntPush(vObjs,iVar1);
    }
    Vec_PtrFreeFree(p_00);
  }
  return;
}

Assistant:

void Cba_NtkObjOrder( Cba_Ntk_t * p, Vec_Int_t * vObjs, Vec_Int_t * vNameIds )
{
    char Buffer[1000], * pName;
    Vec_Ptr_t * vNames;
    int i, iObj;
    if ( Vec_IntSize(vObjs) < 2 )
        return;
    vNames = Vec_PtrAlloc( Vec_IntSize(vObjs) );
    Vec_IntForEachEntry( vObjs, iObj, i )
    {
        char * pTypeName = Cba_NtkTypeName( p, Cba_ObjType(p, iObj) );
        char * pInstName = vNameIds ? Cba_NtkStr(p, Vec_IntEntry(vNameIds, i)) : Cba_ObjNameStr(p, iObj);
        sprintf( Buffer, "%s_%s_%d", pTypeName, pInstName, iObj );
        Vec_PtrPush( vNames, Abc_UtilStrsav(Buffer) );
    }
    // print before
//    Vec_PtrForEachEntry( char *, vNames, pName, i )
//        printf( "%s \n", pName );
//    printf( "\n" );
    // do the sorting
    Vec_PtrSort( vNames, (int (*)(void))Cba_StrCmp );
    // print after
//    Vec_PtrForEachEntry( char *, vNames, pName, i )
//        printf( "%s \n", pName );
//    printf( "\n" );
    // reload in a new order
    Vec_IntClear( vObjs );
    Vec_PtrForEachEntry( char *, vNames, pName, i )
        Vec_IntPush( vObjs, atoi(strrchr(pName, '_')+1) );
    Vec_PtrFreeFree( vNames );
}